

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswRarity.c
# Opt level: O3

int Ssw_RarManCheckNonConstOutputs(Ssw_RarMan_t *p,int iFrame,abctime Time)

{
  int *piVar1;
  Aig_Obj_t *pObj;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  Vec_Ptr_t *pVVar6;
  void **__s;
  Ssw_RarPars_t *pSVar7;
  ulong uVar8;
  uint uVar9;
  Aig_Man_t *pAVar10;
  long lVar11;
  long lVar12;
  
  p->iFailPo = -1;
  p->iFailPat = -1;
  pAVar10 = p->pAig;
  uVar8 = (ulong)(uint)pAVar10->nTruePos;
  if (pAVar10->nTruePos < 1) {
    uVar5 = 0;
  }
  else {
    lVar12 = 0;
    do {
      if (pAVar10->vCos->nSize <= lVar12) goto LAB_006ae1ce;
      pObj = (Aig_Obj_t *)pAVar10->vCos->pArray[lVar12];
      if ((pAVar10->nConstrs != 0) && ((int)uVar8 - pAVar10->nConstrs <= lVar12)) break;
      pVVar6 = p->vCexes;
      if (pVVar6 == (Vec_Ptr_t *)0x0) {
LAB_006ae036:
        iVar3 = Ssw_RarManPoIsConst0(p,pObj);
        if (iVar3 == 0) {
          p->iFailPo = (int)lVar12;
          iVar3 = Ssw_RarManObjWhichOne(p,pObj);
          p->iFailPat = iVar3;
          if (p->pPars->fSolveAll == 0) break;
          piVar1 = &p->pPars->nSolved;
          *piVar1 = *piVar1 + 1;
          pVVar6 = p->vCexes;
          if (pVVar6 == (Vec_Ptr_t *)0x0) {
            iVar3 = p->pAig->nTruePos;
            pVVar6 = (Vec_Ptr_t *)malloc(0x10);
            iVar4 = iVar3;
            if (iVar3 - 1U < 7) {
              iVar4 = 8;
            }
            pVVar6->nCap = iVar4;
            if (iVar4 == 0) {
              __s = (void **)0x0;
            }
            else {
              __s = (void **)malloc((long)iVar4 << 3);
            }
            lVar11 = (long)iVar3;
            pVVar6->pArray = __s;
            pVVar6->nSize = iVar3;
            memset(__s,0,lVar11 * 8);
            p->vCexes = pVVar6;
          }
          else {
            lVar11 = (long)pVVar6->nSize;
          }
          if (lVar11 <= lVar12) {
LAB_006ae1ce:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          if (pVVar6->pArray[lVar12] != (void *)0x0) {
            __assert_fail("Vec_PtrEntry(p->vCexes, i) == NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssw/sswRarity.c"
                          ,0x26b,"int Ssw_RarManCheckNonConstOutputs(Ssw_RarMan_t *, int, abctime)")
            ;
          }
          pVVar6->pArray[lVar12] = (void *)0x1;
          pSVar7 = p->pPars;
          if (pSVar7->pFuncOnFail != (_func_int_int_Abc_Cex_t_ptr *)0x0) {
            iVar3 = (*pSVar7->pFuncOnFail)((int)lVar12,(Abc_Cex_t *)0x0);
            if (iVar3 != 0) {
              return 2;
            }
            pSVar7 = p->pPars;
          }
          if (pSVar7->fNotVerbose == 0) {
            uVar5 = p->pAig->nTruePos;
            uVar8 = (ulong)uVar5;
            if (1 < uVar5) {
              uVar8 = 0;
              uVar9 = uVar5 - 1;
              do {
                uVar8 = (ulong)((int)uVar8 + 1);
                bVar2 = 9 < uVar9;
                uVar9 = uVar9 / 10;
              } while (bVar2);
            }
            Abc_Print(uVar5,
                      "Output %*d was asserted in frame %4d (solved %*d out of %*d outputs).  ",
                      uVar8,(ulong)(uint)p->iFailPo,(ulong)(uint)iFrame,uVar8,
                      (ulong)(uint)pSVar7->nSolved,uVar8,(ulong)uVar5);
            Abc_Print(uVar5,"%s =","Time");
            Abc_Print(uVar5,"%9.2f sec\n",(double)Time / 1000000.0);
          }
        }
      }
      else {
        if (pVVar6->nSize <= lVar12) goto LAB_006ae1ce;
        if (pVVar6->pArray[lVar12] == (void *)0x0) goto LAB_006ae036;
      }
      lVar12 = lVar12 + 1;
      pAVar10 = p->pAig;
      uVar8 = (ulong)pAVar10->nTruePos;
    } while (lVar12 < (long)uVar8);
    uVar5 = (uint)~p->iFailPo >> 0x1f;
  }
  return uVar5;
}

Assistant:

int Ssw_RarManCheckNonConstOutputs( Ssw_RarMan_t * p, int iFrame, abctime Time )
{
    Aig_Obj_t * pObj;
    int i;
    p->iFailPo  = -1;
    p->iFailPat = -1;
    Saig_ManForEachPo( p->pAig, pObj, i )
    {
        if ( p->pAig->nConstrs && i >= Saig_ManPoNum(p->pAig) - p->pAig->nConstrs )
            break;
        if ( p->vCexes && Vec_PtrEntry(p->vCexes, i) )
            continue;
        if ( Ssw_RarManPoIsConst0(p, pObj) )
            continue;
        p->iFailPo  = i;
        p->iFailPat = Ssw_RarManObjWhichOne( p, pObj );
        if ( !p->pPars->fSolveAll )
            break;
        // remember the one solved
        p->pPars->nSolved++;
        if ( p->vCexes == NULL )
            p->vCexes = Vec_PtrStart( Saig_ManPoNum(p->pAig) );
        assert( Vec_PtrEntry(p->vCexes, i) == NULL );
        Vec_PtrWriteEntry( p->vCexes, i, (void *)(ABC_PTRINT_T)1 );
        if ( p->pPars->pFuncOnFail && p->pPars->pFuncOnFail(i, NULL) )
            return 2; // quitting due to callback
        // print final report
        if ( !p->pPars->fNotVerbose )
        {
            int nOutDigits = Abc_Base10Log( Saig_ManPoNum(p->pAig) );
            Abc_Print( 1, "Output %*d was asserted in frame %4d (solved %*d out of %*d outputs).  ", 
                nOutDigits, p->iFailPo, iFrame, 
                nOutDigits, p->pPars->nSolved, 
                nOutDigits, Saig_ManPoNum(p->pAig) );
            Abc_PrintTime( 1, "Time", Time );
        }
    }
    if ( p->iFailPo >= 0 ) // found CEX
        return 1;
    else
        return 0;
}